

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O0

void __thiscall
slang::ast::InstanceCacheKey::InstanceCacheKey
          (InstanceCacheKey *this,InstanceSymbol *symbol,bool *valid)

{
  SourceRange referencingRange;
  bool bVar1;
  Type *this_00;
  reference ppPVar2;
  reference ppPVar3;
  type *ppSVar4;
  type *ppMVar5;
  InstanceArraySymbol *pIVar6;
  reference ppSVar7;
  InstanceSymbol *__args;
  ParameterSymbol *in_RDX;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> sVar8;
  InstanceCacheKey ifaceKey;
  InstanceSymbol *ifaceInst;
  InstanceArraySymbol *arr;
  type *modport;
  type *iface;
  PortConnection *conn;
  iterator __end2_1;
  iterator __begin2_1;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *__range2_1;
  ParameterSymbolBase *param;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> *__range2;
  size_t h;
  InstanceBodySymbol *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  ParameterSymbol *in_stack_fffffffffffffeb0;
  __normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
  local_b0;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> local_a8;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *local_98;
  size_t local_90;
  size_t local_78;
  ParameterSymbolBase *local_70;
  ParameterSymbolBase **local_68;
  __normal_iterator<const_slang::ast::ParameterSymbolBase_*const_*,_std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>_>
  local_60;
  Type *local_58;
  size_t local_50;
  Type **local_48;
  DefinitionSymbol *local_30;
  undefined8 local_28;
  SourceLocation this_01;
  SourceLocation SVar9;
  
  this_01 = in_RSI;
  SVar9 = in_RDI;
  not_null<const_slang::ast::InstanceSymbol_*>::not_null<const_slang::ast::InstanceSymbol_*>
            ((not_null<const_slang::ast::InstanceSymbol_*> *)in_RDI,
             (InstanceSymbol **)&stack0xffffffffffffffe0);
  std::
  vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
  ::vector((vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
            *)0x11616b5);
  local_28 = 0;
  local_30 = InstanceSymbol::getDefinition((InstanceSymbol *)0x11616ce);
  hash_combine<slang::ast::DefinitionSymbol_const*>
            ((size_t *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
             (DefinitionSymbol **)in_stack_fffffffffffffe38);
  sVar8 = InstanceBodySymbol::getParameters(in_stack_fffffffffffffe38);
  local_50 = (size_t)sVar8._M_extent._M_extent_value;
  this_00 = (Type *)sVar8._M_ptr;
  local_48 = &local_58;
  local_58 = this_00;
  local_60._M_current =
       (ParameterSymbolBase **)
       std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffffe38);
  local_68 = (ParameterSymbolBase **)
             std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>::end
                       ((span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>
                         *)in_stack_fffffffffffffe48);
  while (bVar1 = __gnu_cxx::
                 operator==<const_slang::ast::ParameterSymbolBase_*const_*,_std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::ParameterSymbolBase_*const_*,_std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>_>
                             *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                            (__normal_iterator<const_slang::ast::ParameterSymbolBase_*const_*,_std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffe38), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppPVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::ParameterSymbolBase_*const_*,_std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>_>
              ::operator*(&local_60);
    local_70 = *ppPVar2;
    if (local_70->symbol->kind == Parameter) {
      in_stack_fffffffffffffeb0 = Symbol::as<slang::ast::ParameterSymbol>((Symbol *)0x11617d8);
      SourceRange::SourceRange
                ((SourceRange *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
      referencingRange.endLoc = SVar9;
      referencingRange.startLoc = this_01;
      ParameterSymbol::getValue(in_RDX,referencingRange);
      local_78 = slang::ConstantValue::hash
                           ((ConstantValue *)
                            CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
      hash_combine<unsigned_long>
                ((size_t *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                 (unsigned_long *)in_stack_fffffffffffffe38);
    }
    else {
      Symbol::as<slang::ast::TypeParameterSymbol>((Symbol *)0x116186f);
      DeclaredType::getType((DeclaredType *)in_stack_fffffffffffffeb0);
      local_90 = Type::hash(this_00);
      hash_combine<unsigned_long>
                ((size_t *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                 (unsigned_long *)in_stack_fffffffffffffe38);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::ParameterSymbolBase_*const_*,_std::span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL>_>
    ::operator++(&local_60);
  }
  local_a8 = InstanceSymbol::getPortConnections((InstanceSymbol *)in_stack_fffffffffffffe38);
  local_98 = &local_a8;
  local_b0._M_current =
       (PortConnection **)
       std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffffe38);
  std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>::end
            (in_stack_fffffffffffffe48);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
                        *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                       (__normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffe38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      *(undefined8 *)((long)in_RDI + 0x20) = local_28;
      return;
    }
    ppPVar3 = __gnu_cxx::
              __normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
              ::operator*(&local_b0);
    if ((*ppPVar3)->port->kind == InterfacePort) {
      PortConnection::getIfaceConn
                ((PortConnection *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
      ppSVar4 = std::get<0ul,slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>
                          ((pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*> *)
                           0x11619cf);
      ppMVar5 = std::get<1ul,slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>
                          ((pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*> *)
                           0x11619e4);
      while( true ) {
        bVar1 = false;
        if (*ppSVar4 != (type)0x0) {
          bVar1 = (*ppSVar4)->kind == InstanceArray;
        }
        if (!bVar1) break;
        pIVar6 = Symbol::as<slang::ast::InstanceArraySymbol>((Symbol *)0x1161a2f);
        in_stack_fffffffffffffe57 =
             Scope::empty((Scope *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
        if ((bool)in_stack_fffffffffffffe57) {
          *ppSVar4 = (type)0x0;
        }
        else {
          ppSVar7 = std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::operator[]
                              (&pIVar6->elements,0);
          *ppSVar4 = *ppSVar7;
        }
      }
      if (*ppSVar4 != (type)0x0) {
        __args = Symbol::as<slang::ast::InstanceSymbol>((Symbol *)0x1161abf);
        in_stack_fffffffffffffe47 =
             isEligibleForCaching
                       ((InstanceSymbol *)
                        CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
        if (!(bool)in_stack_fffffffffffffe47) {
          *(undefined1 *)&(in_RDX->super_ValueSymbol).super_Symbol.kind = Unknown;
          return;
        }
        InstanceCacheKey((InstanceCacheKey *)this_01,(InstanceSymbol *)in_RDX,(bool *)in_RSI);
        if (((in_RDX->super_ValueSymbol).super_Symbol.kind & Root) == Unknown) {
          bVar1 = true;
        }
        else {
          std::
          vector<std::pair<slang::ast::InstanceCacheKey,slang::ast::ModportSymbol_const*>,std::allocator<std::pair<slang::ast::InstanceCacheKey,slang::ast::ModportSymbol_const*>>>
          ::emplace_back<slang::ast::InstanceCacheKey,slang::ast::ModportSymbol_const*&>
                    ((vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                      *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                     (InstanceCacheKey *)__args,
                     (ModportSymbol **)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40)
                    );
          std::
          vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
          ::back((vector<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
          hash_combine<unsigned_long>
                    ((size_t *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                     (unsigned_long *)in_stack_fffffffffffffe38);
          if (*ppMVar5 != (type)0x0) {
            hash_combine<std::basic_string_view<char,std::char_traits<char>>>
                      ((size_t *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                       (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe38
                      );
          }
          bVar1 = false;
        }
        ~InstanceCacheKey((InstanceCacheKey *)0x1161bef);
        if (bVar1) {
          return;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::PortConnection_*const_*,_std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>_>
    ::operator++(&local_b0);
  } while( true );
}

Assistant:

InstanceCacheKey::InstanceCacheKey(const InstanceSymbol& symbol, bool& valid) : symbol(&symbol) {
    size_t h = 0;
    hash_combine(h, &symbol.getDefinition());

    for (auto param : symbol.body.getParameters()) {
        if (param->symbol.kind == SymbolKind::Parameter)
            hash_combine(h, param->symbol.as<ParameterSymbol>().getValue().hash());
        else
            hash_combine(h, param->symbol.as<TypeParameterSymbol>().targetType.getType().hash());
    }

    for (auto conn : symbol.getPortConnections()) {
        if (conn->port.kind == SymbolKind::InterfacePort) {
            auto [iface, modport] = conn->getIfaceConn();
            while (iface && iface->kind == SymbolKind::InstanceArray) {
                auto& arr = iface->as<InstanceArraySymbol>();
                if (arr.empty())
                    iface = nullptr;
                else
                    iface = arr.elements[0];
            }

            if (iface) {
                auto& ifaceInst = iface->as<InstanceSymbol>();
                if (!isEligibleForCaching(ifaceInst)) {
                    valid = false;
                    return;
                }

                InstanceCacheKey ifaceKey(ifaceInst, valid);
                if (!valid)
                    return;

                ifaceKeys.emplace_back(std::move(ifaceKey), modport);
                hash_combine(h, ifaceKeys.back().first.savedHash);

                if (modport)
                    hash_combine(h, modport->name);
            }
        }
    }

    savedHash = h;
}